

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O1

void __thiscall
glu::TextureCube::loadCompressed
          (TextureCube *this,int numLevels,CompressedTexture *levels,
          TexDecompressionParams *decompressionParams)

{
  CompressedTexture *this_00;
  pointer pPVar1;
  code *pcVar2;
  pointer puVar3;
  int iVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  TestError *this_01;
  long lVar8;
  ulong uVar9;
  CubeFace face;
  long lVar10;
  long local_88;
  PixelBufferAccess refLevelAccess;
  long lVar7;
  
  iVar4 = (*this->m_context->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  dVar5 = getGLFormat(levels->m_format);
  if (this->m_glTexture == 0) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"m_glTexture",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x19e);
LAB_0018fe6d:
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar7 + 0xb8))(0x8513);
  if (0 < numLevels) {
    local_88 = 0;
    uVar9 = 0;
    do {
      lVar10 = 0;
      do {
        face = (CubeFace)lVar10;
        iVar4 = (int)uVar9 * 6 + face;
        tcu::TextureCube::allocLevel(&this->m_refTexture,face,(int)uVar9);
        pPVar1 = (this->m_refTexture).m_access[lVar10].
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        refLevelAccess.super_ConstPixelBufferAccess.m_format = *(TextureFormat *)(pPVar1 + uVar9);
        lVar8 = 2;
        do {
          refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[lVar8 + -2] =
               *(int *)((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar8 * 4 + local_88 + -8);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 5);
        lVar8 = 5;
        do {
          refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[lVar8 + -2] =
               *(int *)((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar8 * 4 + local_88 + -8);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        refLevelAccess.super_ConstPixelBufferAccess.m_data =
             *(void **)((TextureFormat *)(pPVar1 + uVar9) + 4);
        if ((levels[iVar4].m_width != refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[0])
           || (this_00 = levels + iVar4,
              this_00->m_height != refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[1])) {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,(char *)0x0,
                     "level.getWidth() == refLevelAccess.getWidth() && level.getHeight() == refLevelAccess.getHeight()"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                     ,0x1ab);
          goto LAB_0018fe6d;
        }
        tcu::CompressedTexture::decompress(this_00,&refLevelAccess,decompressionParams);
        pcVar2 = *(code **)(lVar7 + 0x288);
        dVar6 = getGLCubeFace(face);
        puVar3 = (this_00->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (*pcVar2)(dVar6,uVar9 & 0xffffffff,dVar5,this_00->m_width,this_00->m_height,0,
                  *(int *)&(this_00->m_data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (int)puVar3,puVar3);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 6);
      uVar9 = uVar9 + 1;
      local_88 = local_88 + 0x28;
    } while (uVar9 != (uint)numLevels);
  }
  dVar5 = (**(code **)(lVar7 + 0x800))();
  checkError(dVar5,"Texture upload failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x1b4);
  return;
}

Assistant:

void TextureCube::loadCompressed (int numLevels, const tcu::CompressedTexture* levels, const tcu::TexDecompressionParams& decompressionParams)
{
	const glw::Functions&	gl					= m_context.getFunctions();
	deUint32				compressedFormat	= getGLFormat(levels[0].getFormat());

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_glTexture);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			const tcu::CompressedTexture& level = levels[levelNdx*tcu::CUBEFACE_LAST + face];

			// Decompress to reference texture.
			m_refTexture.allocLevel((tcu::CubeFace)face, levelNdx);
			tcu::PixelBufferAccess refLevelAccess = m_refTexture.getLevelFace(levelNdx, (tcu::CubeFace)face);
			TCU_CHECK(level.getWidth()	== refLevelAccess.getWidth() &&
					  level.getHeight()	== refLevelAccess.getHeight());
			level.decompress(refLevelAccess, decompressionParams);

			// Upload to GL texture in compressed form.
			gl.compressedTexImage2D(getGLCubeFace((tcu::CubeFace)face), levelNdx, compressedFormat,
									level.getWidth(), level.getHeight(), 0 /* border */, level.getDataSize(), level.getData());
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}